

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O0

void __thiscall
cfd::core::CfdCoreManager::Finalize
          (CfdCoreManager *this,CfdCoreHandle handle,bool is_finish_process)

{
  int *piVar1;
  bool bVar2;
  reference ppiVar3;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  vector<int_*,_std::allocator<int_*>_> *this_00;
  const_iterator local_70;
  CfdSourceLocation local_58;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_40;
  int **local_38;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_30;
  iterator ite;
  lock_guard<std::mutex> lock;
  int *piStack_18;
  bool is_finish_process_local;
  CfdCoreHandle handle_local;
  CfdCoreManager *this_local;
  
  if (((this->initialized_ & 1U) != 0) &&
     (piStack_18 = (int *)handle, handle_local = this,
     bVar2 = ::std::vector<int_*,_std::allocator<int_*>_>::empty(&this->handle_list_), !bVar2)) {
    ::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
    __normal_iterator(&local_30);
    local_38 = (int **)::std::vector<int_*,_std::allocator<int_*>_>::begin(&this->handle_list_);
    local_30._M_current = local_38;
    while( true ) {
      local_40._M_current =
           (int **)::std::vector<int_*,_std::allocator<int_*>_>::end(&this->handle_list_);
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_40);
      piVar1 = piStack_18;
      if (!bVar2) break;
      ppiVar3 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                operator*(&local_30);
      if (piVar1 == *ppiVar3) {
        if (piStack_18 != (int *)0x0) {
          operator_delete__(piStack_18);
        }
        if (!is_finish_process) {
          local_58.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_manager.cpp"
                       ,0x2f);
          local_58.filename = local_58.filename + 1;
          local_58.line = 0x6f;
          local_58.funcname = "Finalize";
          logger::info<void*const&>(&local_58,"core finalize. addr={:p}.",&stack0xffffffffffffffe8);
        }
        this_00 = &this->handle_list_;
        __gnu_cxx::__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>>::
        __normal_iterator<int**>
                  ((__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>> *)&local_70
                   ,&local_30);
        ::std::vector<int_*,_std::allocator<int_*>_>::erase(this_00,local_70);
        break;
      }
      __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::operator++
                (&local_30);
    }
    bVar2 = ::std::vector<int_*,_std::allocator<int_*>_>::empty(&this->handle_list_);
    if (bVar2) {
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
      this->finalized_ = true;
    }
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x704f08);
  }
  return;
}

Assistant:

void CfdCoreManager::Finalize(
    const CfdCoreHandle handle, bool is_finish_process) {
  if (initialized_ && (!handle_list_.empty())) {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);

    std::vector<int*>::iterator ite;
    for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
      if (handle == *ite) {
        delete[] static_cast<int*>(handle);
        if (!is_finish_process) {
          info(CFD_LOG_SOURCE, "core finalize. addr={:p}.", handle);
        }
        handle_list_.erase(ite);
        break;
      }
    }

    if (handle_list_.empty()) {
      // Perform end processing
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
#if 0
      hid_exit();
#endif
      finalized_ = true;
    }
  }
}